

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O1

void __thiscall
bssl::gtest_suite_PkitsTest14DistributionPoints_::
Section14InvalidcRLIssuerTest34<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::TestBody
          (Section14InvalidcRLIssuerTest34<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.14.34";
  local_88.should_validate = false;
  PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::RunTest<3ul,2ul>
            ((PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_3fc32f_006d1940,(char *(*) [3])&PTR_anon_var_dwarf_3fc361_006d1a10,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest14DistributionPoints,
                     Section14InvalidcRLIssuerTest34) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "indirectCRLCA5Cert",
                               "InvalidcRLIssuerTest34EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "indirectCRLCA5CRL"};
  PkitsTestInfo info;
  info.test_number = "4.14.34";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}